

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int breplace(bstring b1,int pos,int len,bstring b2,uchar fill)

{
  int iVar1;
  int iVar2;
  bstring b;
  long lVar3;
  uchar *puVar4;
  int iVar5;
  
  iVar2 = -1;
  if ((len | pos) < 0) {
    return -1;
  }
  if (b2 == (bstring)0x0 || b1 == (bstring)0x0) {
    return -1;
  }
  if (b1->data == (uchar *)0x0) {
    return -1;
  }
  if (b2->data == (uchar *)0x0) {
    return -1;
  }
  iVar1 = b1->slen;
  if ((long)iVar1 < 0) {
    return -1;
  }
  iVar5 = b2->slen;
  if (iVar5 < 0) {
    return -1;
  }
  if (b1->mlen < 1 || b1->mlen < iVar1) {
    return -1;
  }
  if (iVar1 <= len + pos) {
    iVar2 = bsetstr(b1,pos,b2,fill);
    if (iVar2 < 0) {
      return -1;
    }
    lVar3 = (long)pos + (long)b2->slen;
    iVar2 = (int)lVar3;
    if (b1->slen <= iVar2) {
      return 0;
    }
    b1->slen = iVar2;
    b1->data[lVar3] = '\0';
    return 0;
  }
  lVar3 = (long)b2->data - (long)b1->data;
  b = b2;
  if (lVar3 < iVar1 && -1 < lVar3) {
    b = bstrcpy(b2);
    if (b == (bstring)0x0) {
      return -1;
    }
    iVar5 = b->slen;
  }
  if (iVar5 - len != 0 && len <= iVar5) {
    iVar1 = balloc(b1,(iVar5 - len) + b1->slen);
    if (iVar1 != 0) goto LAB_0011a012;
    iVar5 = b->slen;
  }
  puVar4 = b1->data;
  iVar2 = len;
  if (iVar5 != len) {
    memmove(puVar4 + (long)iVar5 + (ulong)(uint)pos,puVar4 + (ulong)(uint)len + (ulong)(uint)pos,
            (long)b1->slen - (long)(len + pos));
    puVar4 = b1->data;
    iVar2 = b->slen;
  }
  memcpy(puVar4 + (uint)pos,b->data,(long)iVar2);
  lVar3 = (long)b1->slen + ((long)b->slen - (long)len);
  b1->slen = (int)lVar3;
  b1->data[lVar3] = '\0';
  iVar2 = 0;
LAB_0011a012:
  if (b != b2) {
    bdestroy(b);
  }
  return iVar2;
}

Assistant:

int breplace (bstring b1, int pos, int len, const bstring b2, 
			  unsigned char fill) {
int pl, ret;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || len < 0 || (pl = pos + len) < 0 || b1 == NULL || 
	    b2 == NULL || b1->data == NULL || b2->data == NULL || 
	    b1->slen < 0 || b2->slen < 0 || b1->mlen < b1->slen ||
	    b1->mlen <= 0) return BSTR_ERR;

	/* Straddles the end? */
	if (pl >= b1->slen) {
		if ((ret = bsetstr (b1, pos, b2, fill)) < 0) return ret;
		if (pos + b2->slen < b1->slen) {
			b1->slen = pos + b2->slen;
			b1->data[b1->slen] = (unsigned char) '\0';
		}
		return ret;
	}

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->slen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	if (aux->slen > len) {
		if (balloc (b1, b1->slen + aux->slen - len) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	if (aux->slen != len) bstr__memmove (b1->data + pos + aux->slen, b1->data + pos + len, b1->slen - (pos + len));
	bstr__memcpy (b1->data + pos, aux->data, aux->slen);
	b1->slen += aux->slen - len;
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return BSTR_OK;
}